

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O1

double SubsetCountMintermAux(DdNode *node,double max,st__table *table)

{
  NodeData_t *pNVar1;
  double *pdVar2;
  double **ppdVar3;
  NodeData_t **ppNVar4;
  int iVar5;
  int iVar6;
  double **ppdVar7;
  long lVar8;
  uint uVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  NodeData_t *dummy;
  char *local_38;
  
  piVar10 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar10 == 0x7fffffff) {
    if (zero != node) {
      return max;
    }
    return 0.0;
  }
  iVar6 = st__lookup(table,(char *)node,&local_38);
  if (iVar6 != 0) {
    return **(double **)local_38;
  }
  uVar13 = *(ulong *)(piVar10 + 6);
  uVar14 = (ulong)((uint)node & 1);
  dVar15 = SubsetCountMintermAux((DdNode *)(*(ulong *)(piVar10 + 4) ^ uVar14),max,table);
  if (memOut != '\0') {
    return 0.0;
  }
  dVar16 = SubsetCountMintermAux((DdNode *)(uVar14 ^ uVar13),max,table);
  iVar5 = maxPages;
  iVar6 = page;
  if (memOut != '\0') {
    return 0.0;
  }
  if (pageIndex == 0x800) {
    lVar11 = (long)page;
    uVar9 = page + 1;
    lVar12 = (long)maxPages;
    page = uVar9;
    ppdVar7 = mintermPages;
    if (uVar9 == maxPages) {
      ppdVar7 = (double **)malloc(lVar12 * 8 + 0x400);
      ppdVar3 = mintermPages;
      if (ppdVar7 != (double **)0x0) {
        maxPages = iVar5 + 0x80;
        if (0 < iVar5) {
          lVar8 = 0;
          do {
            ppdVar7[lVar8] = ppdVar3[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar12 != lVar8);
        }
        if (mintermPages != (double **)0x0) {
          free(mintermPages);
        }
        goto LAB_009163a2;
      }
      ppdVar7 = mintermPages;
      if (-1 < iVar6) {
        uVar13 = 0;
        do {
          if (ppdVar3[uVar13] != (double *)0x0) {
            free(ppdVar3[uVar13]);
            ppdVar3[uVar13] = (double *)0x0;
          }
          uVar13 = uVar13 + 1;
          ppdVar7 = mintermPages;
        } while (uVar9 != uVar13);
      }
    }
    else {
LAB_009163a2:
      mintermPages = ppdVar7;
      currentMintermPage = (double *)malloc(0x4000);
      ppdVar7 = mintermPages;
      mintermPages[lVar11 + 1] = currentMintermPage;
      if (currentMintermPage != (double *)0x0) {
        pageIndex = 0;
        goto LAB_00916459;
      }
      if (-1 < iVar6) {
        uVar13 = 0;
        do {
          if (ppdVar7[uVar13] != (double *)0x0) {
            free(ppdVar7[uVar13]);
            ppdVar7[uVar13] = (double *)0x0;
          }
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
      }
    }
    if (ppdVar7 != (double **)0x0) {
      free(ppdVar7);
      mintermPages = (double **)0x0;
    }
    memOut = '\x01';
  }
LAB_00916459:
  pdVar2 = currentMintermPage;
  ppNVar4 = nodeDataPages;
  if (memOut == '\x01') {
    uVar13 = (ulong)(uint)nodeDataPage;
    if (-1 < nodeDataPage) {
      lVar11 = 0;
      do {
        pNVar1 = ppNVar4[lVar11];
        if (pNVar1 != (NodeData_t *)0x0) {
          free(pNVar1);
          ppNVar4[lVar11] = (NodeData_t *)0x0;
        }
        lVar11 = lVar11 + 1;
      } while (uVar13 + 1 != lVar11);
    }
  }
  else {
    dVar15 = dVar16 * 0.5 + dVar15 * 0.5;
    lVar11 = (long)pageIndex;
    pageIndex = pageIndex + 1;
    currentMintermPage[lVar11] = dVar15;
    if (nodeDataPageIndex == 0x400) {
      ResizeNodeDataPages();
    }
    ppdVar7 = mintermPages;
    if (memOut == '\x01') {
      uVar13 = (ulong)(uint)page;
      if (-1 < page) {
        lVar11 = 0;
        do {
          pdVar2 = ppdVar7[lVar11];
          if (pdVar2 != (double *)0x0) {
            free(pdVar2);
            ppdVar7[lVar11] = (double *)0x0;
          }
          lVar11 = lVar11 + 1;
        } while (uVar13 + 1 != lVar11);
      }
      if (mintermPages != (double **)0x0) {
        free(mintermPages);
        mintermPages = (double **)0x0;
      }
      goto LAB_0091656e;
    }
    pNVar1 = currentNodeDataPage + nodeDataPageIndex;
    nodeDataPageIndex = nodeDataPageIndex + 1;
    pNVar1->mintermPointer = pdVar2 + lVar11;
    pNVar1->nodesPointer = (int *)0x0;
    iVar6 = st__insert(table,(char *)node,(char *)pNVar1);
    ppdVar7 = mintermPages;
    if (iVar6 != -10000) {
      return dVar15;
    }
    memOut = '\x01';
    uVar13 = (ulong)(uint)page;
    if (-1 < page) {
      lVar11 = 0;
      do {
        pdVar2 = ppdVar7[lVar11];
        if (pdVar2 != (double *)0x0) {
          free(pdVar2);
          ppdVar7[lVar11] = (double *)0x0;
        }
        lVar11 = lVar11 + 1;
      } while (uVar13 + 1 != lVar11);
    }
    if (mintermPages != (double **)0x0) {
      free(mintermPages);
      mintermPages = (double **)0x0;
    }
    ppNVar4 = nodeDataPages;
    uVar13 = (ulong)(uint)nodeDataPage;
    if (-1 < nodeDataPage) {
      lVar11 = 0;
      do {
        pNVar1 = ppNVar4[lVar11];
        if (pNVar1 != (NodeData_t *)0x0) {
          free(pNVar1);
          ppNVar4[lVar11] = (NodeData_t *)0x0;
        }
        lVar11 = lVar11 + 1;
      } while (uVar13 + 1 != lVar11);
    }
  }
  if (nodeDataPages != (NodeData_t **)0x0) {
    free(nodeDataPages);
    nodeDataPages = (NodeData_t **)0x0;
  }
LAB_0091656e:
  st__free_table(table);
  return 0.0;
}

Assistant:

static double
SubsetCountMintermAux(
  DdNode * node /* function to analyze */,
  double  max /* number of minterms of constant 1 */,
  st__table * table /* visitedTable table */)
{

    DdNode      *N,*Nv,*Nnv; /* nodes to store cofactors  */
    double      min,*pmin; /* minterm count */
    double      min1, min2; /* minterm count */
    NodeData_t *dummy;
    NodeData_t *newEntry;
    int i;

#ifdef DEBUG
    num_calls++;
#endif

    /* Constant case */
    if (Cudd_IsConstant(node)) {
        if (node == zero) {
            return(0.0);
        } else {
            return(max);
        }
    } else {

        /* check if entry for this node exists */
        if ( st__lookup(table, (const char *)node, (char **)&dummy)) {
            min = *(dummy->mintermPointer);
            return(min);
        }

        /* Make the node regular to extract cofactors */
        N = Cudd_Regular(node);

        /* store the cofactors */
        Nv = Cudd_T(N);
        Nnv = Cudd_E(N);

        Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
        Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

        min1 =  SubsetCountMintermAux(Nv, max,table)/2.0;
        if (memOut) return(0.0);
        min2 =  SubsetCountMintermAux(Nnv,max,table)/2.0;
        if (memOut) return(0.0);
        min = (min1+min2);

        /* if page index is at the bottom, then create a new page */
        if (pageIndex == pageSize) ResizeCountMintermPages();
        if (memOut) {
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0.0);
        }

        /* point to the correct location in the page */
        pmin = currentMintermPage+pageIndex;
        pageIndex++;

        /* store the minterm count of this node in the page */
        *pmin = min;

        /* Note I allocate the struct here. Freeing taken care of later */
        if (nodeDataPageIndex == nodeDataPageSize) ResizeNodeDataPages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            st__free_table(table);
            return(0.0);
        }

        newEntry = currentNodeDataPage + nodeDataPageIndex;
        nodeDataPageIndex++;

        /* points to the correct location in the page */
        newEntry->mintermPointer = pmin;
        /* initialize this field of the Node Quality structure */
        newEntry->nodesPointer = NULL;

        /* insert entry for the node in the table */
        if ( st__insert(table,(char *)node, (char *)newEntry) == st__OUT_OF_MEM) {
            memOut = 1;
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0.0);
        }
        return(min);
    }

}